

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

_binbuf * canvas_docopy(_glist *x)

{
  t_gobj *y;
  int iVar1;
  uint uVar2;
  uint uVar3;
  _binbuf *x_00;
  _outconnect *p_Var4;
  t_symbol *ptVar5;
  t_symbol *ptVar6;
  t_gobj **pptVar7;
  t_linetraverser t;
  
  x_00 = binbuf_new();
  pptVar7 = &x->gl_list;
  while (y = *pptVar7, y != (t_gobj *)0x0) {
    iVar1 = glist_isselected(x,y);
    if (iVar1 != 0) {
      gobj_save(y,x_00);
    }
    pptVar7 = &y->g_next;
  }
  linetraverser_start(&t,x);
  while( true ) {
    p_Var4 = linetraverser_next(&t);
    if (p_Var4 == (_outconnect *)0x0) break;
    iVar1 = glist_isselected(x,&(t.tr_ob)->te_g);
    if (iVar1 != 0) {
      iVar1 = glist_isselected(x,&(t.tr_ob2)->te_g);
      if (iVar1 != 0) {
        ptVar5 = gensym("#X");
        ptVar6 = gensym("connect");
        uVar2 = glist_selectionindex(x,&(t.tr_ob)->te_g,1);
        iVar1 = t.tr_outno;
        uVar3 = glist_selectionindex(x,&(t.tr_ob2)->te_g,1);
        binbuf_addv(x_00,"ssiiii;",ptVar5,ptVar6,(ulong)uVar2,(ulong)(uint)iVar1,(ulong)uVar3,
                    (ulong)(uint)t.tr_inno);
      }
    }
  }
  return x_00;
}

Assistant:

static t_binbuf *canvas_docopy(t_canvas *x)
{
    t_gobj *y;
    t_linetraverser t;
    t_outconnect *oc;
    t_binbuf *b = binbuf_new();
    for (y = x->gl_list; y; y = y->g_next)
    {
        if (glist_isselected(x, y))
            gobj_save(y, b);
    }
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        if (glist_isselected(x, &t.tr_ob->ob_g)
            && glist_isselected(x, &t.tr_ob2->ob_g))
        {
            binbuf_addv(b, "ssiiii;", gensym("#X"), gensym("connect"),
                glist_selectionindex(x, &t.tr_ob->ob_g, 1), t.tr_outno,
                glist_selectionindex(x, &t.tr_ob2->ob_g, 1), t.tr_inno);
        }
    }
    return (b);
}